

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

string * helics::logLevelToString_abi_cxx11_(LogLevels level)

{
  bool bVar1;
  string *in_RDI;
  const_iterator res;
  string *ret;
  map<helics::LogLevels,_std::basic_string_view<char,_std::char_traits<char>_>,_std::less<helics::LogLevels>,_std::allocator<std::pair<const_helics::LogLevels,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *in_stack_ffffffffffffff88;
  allocator<char> *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  allocator<char> local_21;
  _Self local_20;
  _Self local_18 [3];
  
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<helics::LogLevels,_std::basic_string_view<char,_std::char_traits<char>_>,_std::less<helics::LogLevels>,_std::allocator<std::pair<const_helics::LogLevels,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
       ::find(in_stack_ffffffffffffff78,(key_type *)0x77d2c1);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<helics::LogLevels,_std::basic_string_view<char,_std::char_traits<char>_>,_std::less<helics::LogLevels>,_std::allocator<std::pair<const_helics::LogLevels,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
       ::end(in_stack_ffffffffffffff78);
  bVar1 = std::operator==(local_18,&local_20);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffffa8;
    std::__cxx11::to_string(in_stack_ffffffffffffffcc);
    std::operator+(in_stack_ffffffffffffff88,__rhs);
    std::__cxx11::string::~string(__rhs);
  }
  else {
    std::
    _Rb_tree_const_iterator<std::pair<const_helics::LogLevels,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_helics::LogLevels,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)0x77d2f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffc0,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
    std::allocator<char>::~allocator(&local_21);
  }
  return in_RDI;
}

Assistant:

std::string logLevelToString(LogLevels level)
{
    auto res = levelMaps.find(level);
    if (res != levelMaps.end()) {
        return std::string(res->second);
    }
    std::string ret = "loglevel_" + std::to_string(static_cast<int>(level));
    return ret;
}